

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

void __thiscall
llm_graph_context::llm_graph_context(llm_graph_context *this,llm_graph_params *params)

{
  undefined4 uVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  ulong uVar4;
  undefined8 *in_RSI;
  llama_hparams *in_RDI;
  uint32_t in_stack_ffffffffffffffdc;
  uint uVar5;
  
  uVar1 = *(undefined4 *)(in_RSI + 1);
  in_RDI->vocab_only = (bool)(char)uVar1;
  in_RDI->rope_finetuned = (bool)(char)((uint)uVar1 >> 8);
  in_RDI->use_par_res = (bool)(char)((uint)uVar1 >> 0x10);
  in_RDI->swin_norm = (bool)(char)((uint)uVar1 >> 0x18);
  uVar2 = in_RSI[2];
  in_RDI->n_embd = (int)uVar2;
  in_RDI->n_embd_features = (int)((ulong)uVar2 >> 0x20);
  uVar2 = in_RSI[3];
  in_RDI->n_layer = (int)uVar2;
  in_RDI->n_rot = (int)((ulong)uVar2 >> 0x20);
  uVar2 = in_RSI[4];
  in_RDI->n_swa = (int)uVar2;
  in_RDI->n_swa_pattern = (int)((ulong)uVar2 >> 0x20);
  uVar4 = (ulong)*(uint *)(*(long *)&in_RDI->n_embd + 8);
  in_RDI->n_embd_head_k = (int)uVar4;
  in_RDI->n_embd_head_v = (int)(uVar4 >> 0x20);
  uVar4 = (ulong)*(uint *)(*(long *)&in_RDI->n_embd + 0x10);
  in_RDI->n_expert = (int)uVar4;
  in_RDI->n_expert_used = (int)(uVar4 >> 0x20);
  uVar4 = (ulong)*(uint *)(*(long *)&in_RDI->n_embd + 0x14);
  in_RDI->n_rel_attn_bkts = (int)uVar4;
  in_RDI->n_embd_head_k_mla = (int)(uVar4 >> 0x20);
  uVar5 = **(uint **)&in_RDI->n_layer;
  in_RDI->n_embd_head_v_mla = (int)(ulong)uVar5;
  (in_RDI->posnet).n_embd = (int)((ulong)uVar5 >> 0x20);
  *(ulong *)&(in_RDI->posnet).n_layer =
       (ulong)**(uint **)&in_RDI->n_layer / (ulong)*(uint *)(*(long *)&in_RDI->n_layer + 0xc);
  uVar3 = llama_hparams::n_head(in_RDI,in_stack_ffffffffffffffdc);
  *(ulong *)&(in_RDI->convnext).n_layer = (ulong)uVar3;
  uVar3 = llama_hparams::n_head_kv(in_RDI,in_stack_ffffffffffffffdc);
  *(ulong *)((in_RDI->n_head_arr)._M_elems + 1) = (ulong)uVar3;
  *(ulong *)((in_RDI->n_head_arr)._M_elems + 3) = (ulong)*(uint *)(*(long *)&in_RDI->n_embd + 0x20);
  uVar3 = llama_hparams::n_embd_k_gqa(in_RDI,in_stack_ffffffffffffffdc);
  *(ulong *)((in_RDI->n_head_arr)._M_elems + 5) = (ulong)uVar3;
  *(ulong *)((in_RDI->n_head_arr)._M_elems + 7) = (ulong)*(uint *)(*(long *)&in_RDI->n_embd + 0x24);
  uVar3 = llama_hparams::n_embd_v_gqa(in_RDI,in_stack_ffffffffffffffdc);
  *(ulong *)((in_RDI->n_head_arr)._M_elems + 9) = (ulong)uVar3;
  *(ulong *)((in_RDI->n_head_arr)._M_elems + 0xb) =
       (ulong)*(uint *)(*(long *)&in_RDI->n_embd + 0x28);
  if ((*(byte *)(*(long *)&in_RDI->n_layer + 0x3d) & 1) == 0) {
    uVar5 = *(uint *)(*(long *)&in_RDI->n_embd + 0x2c);
  }
  else {
    uVar5 = *(uint *)(*(long *)&in_RDI->n_embd + 0x28);
  }
  *(ulong *)((in_RDI->n_head_arr)._M_elems + 0xd) = (ulong)uVar5;
  (in_RDI->n_head_arr)._M_elems[0xf] = *(uint *)(*(long *)&in_RDI->n_layer + 0x18);
  (in_RDI->n_head_arr)._M_elems[0x10] = *(uint *)(*(long *)&in_RDI->n_layer + 0x1c);
  (in_RDI->n_head_arr)._M_elems[0x11] = *(uint *)(*(long *)&in_RDI->n_layer + 0x24);
  (in_RDI->n_head_arr)._M_elems[0x12] = *(uint *)(*(long *)&in_RDI->n_layer + 0x28);
  (in_RDI->n_head_arr)._M_elems[0x13] = *(uint *)(*(long *)&in_RDI->n_layer + 0x2c);
  (in_RDI->n_head_arr)._M_elems[0x14] = *(uint *)(*(long *)&in_RDI->n_layer + 0x30);
  (in_RDI->n_head_arr)._M_elems[0x15] = *(uint *)(*(long *)&in_RDI->n_embd + 0x1874);
  (in_RDI->n_head_arr)._M_elems[0x16] = *(uint *)(*(long *)&in_RDI->n_embd + 0x1878);
  (in_RDI->n_head_arr)._M_elems[0x17] = *(uint *)(*(long *)&in_RDI->n_swa + 4);
  (in_RDI->n_head_arr)._M_elems[0x18] = *(uint *)(in_RSI + 0xb);
  (in_RDI->n_head_arr)._M_elems[0x19] = *(uint *)(*(long *)&in_RDI->n_layer + 0x20);
  (in_RDI->n_head_arr)._M_elems[0x1a] = *(uint *)(*(long *)&in_RDI->n_layer + 0x40);
  (in_RDI->n_head_arr)._M_elems[0x1b] = *(uint *)(*(long *)&in_RDI->n_embd + 0x1928);
  *(undefined8 *)((in_RDI->n_head_arr)._M_elems + 0x1d) = *in_RSI;
  *(undefined8 *)((in_RDI->n_head_arr)._M_elems + 0x1f) = in_RSI[5];
  *(undefined8 *)((in_RDI->n_head_arr)._M_elems + 0x21) = in_RSI[6];
  *(undefined8 *)((in_RDI->n_head_arr)._M_elems + 0x23) = in_RSI[7];
  *(undefined8 *)((in_RDI->n_head_arr)._M_elems + 0x25) = in_RSI[8];
  *(undefined8 *)((in_RDI->n_head_arr)._M_elems + 0x27) = in_RSI[9];
  *(undefined8 *)((in_RDI->n_head_arr)._M_elems + 0x29) = in_RSI[10];
  *(undefined8 *)((in_RDI->n_head_arr)._M_elems + 0x2b) = in_RSI[0xc];
  std::make_unique<llm_graph_result>();
  return;
}

Assistant:

llm_graph_context::llm_graph_context(const llm_graph_params & params) :
    arch             (params.arch),
    hparams          (params.hparams),
    cparams          (params.cparams),
    ubatch           (params.ubatch),
    n_embd           (hparams.n_embd),
    n_layer          (hparams.n_layer),
    n_rot            (hparams.n_rot),
    n_ctx            (cparams.n_ctx),
    n_ctx_per_seq    (cparams.n_ctx / cparams.n_seq_max),
    n_head           (hparams.n_head()),
    n_head_kv        (hparams.n_head_kv()),
    n_embd_head_k    (hparams.n_embd_head_k),
    n_embd_k_gqa     (hparams.n_embd_k_gqa()),
    n_embd_head_v    (hparams.n_embd_head_v),
    n_embd_v_gqa     (hparams.n_embd_v_gqa()),
    n_expert         (hparams.n_expert),
    n_expert_used    (cparams.warmup ? hparams.n_expert : hparams.n_expert_used),
    freq_base        (cparams.rope_freq_base),
    freq_scale       (cparams.rope_freq_scale),
    ext_factor       (cparams.yarn_ext_factor),
    attn_factor      (cparams.yarn_attn_factor),
    beta_fast        (cparams.yarn_beta_fast),
    beta_slow        (cparams.yarn_beta_slow),
    norm_eps         (hparams.f_norm_eps),
    norm_rms_eps     (hparams.f_norm_rms_eps),
    n_tokens         (ubatch.n_tokens),
    n_outputs        (params.n_outputs),
    n_ctx_orig       (cparams.n_ctx_orig_yarn),
    pooling_type     (cparams.pooling_type),
    rope_type        (hparams.rope_type),
    ctx0             (params.ctx),
    sched            (params.sched),
    backend_cpu      (params.backend_cpu),
    cvec             (params.cvec),
    loras            (params.loras),
    memory           (params.memory),
    cross            (params.cross),
    cb_func          (params.cb),
    res              (std::make_unique<llm_graph_result>()) {
    }